

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O2

ssize_t compress_filter_read(archive_read_filter *self,void **pblock)

{
  void *pvVar1;
  undefined1 *puVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  undefined1 *puVar6;
  ssize_t sVar7;
  
  pvVar1 = self->data;
  if (*(int *)((long)pvVar1 + 0x3c) == 0) {
    puVar2 = *(undefined1 **)((long)pvVar1 + 0x30);
    lVar3 = *(long *)((long)pvVar1 + 0x28);
    puVar6 = puVar2;
    while ((puVar6 < puVar2 + lVar3 && (*(int *)((long)pvVar1 + 0x3c) == 0))) {
      uVar4 = *(ulong *)((long)pvVar1 + 0x30060);
      if ((long)pvVar1 + 0x30068U < uVar4) {
        *(ulong *)((long)pvVar1 + 0x30060) = uVar4 - 1;
        *puVar6 = *(undefined1 *)(uVar4 - 1);
        puVar6 = puVar6 + 1;
      }
      else {
        iVar5 = next_code(self);
        if (iVar5 != 0) {
          if (iVar5 != -1) {
            return (long)iVar5;
          }
          *(undefined4 *)((long)pvVar1 + 0x3c) = 0xffffffff;
        }
      }
    }
    *pblock = puVar2;
    sVar7 = (long)puVar6 - (long)puVar2;
  }
  else {
    *pblock = (void *)0x0;
    sVar7 = 0;
  }
  return sVar7;
}

Assistant:

static ssize_t
compress_filter_read(struct archive_read_filter *self, const void **pblock)
{
	struct private_data *state;
	unsigned char *p, *start, *end;
	int ret;

	state = (struct private_data *)self->data;
	if (state->end_of_stream) {
		*pblock = NULL;
		return (0);
	}
	p = start = (unsigned char *)state->out_block;
	end = start + state->out_block_size;

	while (p < end && !state->end_of_stream) {
		if (state->stackp > state->stack) {
			*p++ = *--state->stackp;
		} else {
			ret = next_code(self);
			if (ret == -1)
				state->end_of_stream = ret;
			else if (ret != ARCHIVE_OK)
				return (ret);
		}
	}

	*pblock = start;
	return (p - start);
}